

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastInt32ToBufferLeft(int32 i,char *buffer)

{
  char *pcVar1;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt32ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  pcVar1 = FastUInt32ToBufferLeft(i,buffer);
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}